

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_path_unittest.cc
# Opt level: O1

void __thiscall
GetUniquePathTest_OMPI_Test::~GetUniquePathTest_OMPI_Test(GetUniquePathTest_OMPI_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GetUniquePathTest, OMPI) {
  WithEnv withOMPI("OMPI_HOME", "/some/path");
  WithEnv withTestVar(TEST_VAR, TEST_VAL);

  const auto expectedPath = AppendPID(TEST_VAL);

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedPath, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedPath, GetTestPath());

  withTestVar.Reset();
  WithEnv withForced(TEST_VAR "_USE_PID", "1");

  // Test parent case (will set the child flag)
  EXPECT_EQ(expectedPath, GetTestPath());

  // Test child case
  EXPECT_EQ(expectedPath, GetTestPath());
}